

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timerqueue_unittest.cpp
# Opt level: O1

void cancel(TimerId timer)

{
  int iVar1;
  SourceFile file;
  Logger local_1010;
  string local_40;
  Timestamp local_20;
  
  sznet::net::EventLoop::cancel(g_timequeue_loop,timer);
  if (sznet::g_logLevel < 3) {
    file._8_8_ = 0x17;
    file.m_data = "timerqueue_unittest.cpp";
    sznet::Logger::Logger(&local_1010,file,0x27);
    iVar1 = (int)&local_1010 + 0xfb0;
    if (0xd < (uint)(iVar1 - (int)local_1010.m_impl.m_stream.m_buffer.m_cur)) {
      builtin_strncpy(local_1010.m_impl.m_stream.m_buffer.m_cur,"cancelled at ",0xd);
      local_1010.m_impl.m_stream.m_buffer.m_cur = local_1010.m_impl.m_stream.m_buffer.m_cur + 0xd;
    }
    local_20 = sznet::Timestamp::now();
    sznet::Timestamp::toFormattedString_abi_cxx11_(&local_40,&local_20,true);
    if (local_40._M_string_length <
        (ulong)(long)(iVar1 - (int)local_1010.m_impl.m_stream.m_buffer.m_cur)) {
      memcpy(local_1010.m_impl.m_stream.m_buffer.m_cur,local_40._M_dataplus._M_p,
             local_40._M_string_length);
      local_1010.m_impl.m_stream.m_buffer.m_cur =
           local_1010.m_impl.m_stream.m_buffer.m_cur + local_40._M_string_length;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    sznet::Logger::~Logger(&local_1010);
  }
  return;
}

Assistant:

void cancel(TimerId timer)
{
	g_timequeue_loop->cancel(timer);
	LOG_INFO << "cancelled at " << Timestamp::now().toFormattedString();
}